

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

uint16_t paeth_predictor_single(uint16_t left,uint16_t top,uint16_t top_left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort in_DX;
  ushort in_SI;
  uint16_t in_DI;
  int p_top_left;
  int p_top;
  int p_left;
  int base;
  
  iVar1 = ((uint)in_SI + (uint)in_DI) - (uint)in_DX;
  iVar2 = abs_diff(iVar1,(uint)in_DI);
  iVar3 = abs_diff(iVar1,(uint)in_SI);
  iVar1 = abs_diff(iVar1,(uint)in_DX);
  if (((iVar3 < iVar2) || (iVar1 < iVar2)) && (in_DI = in_DX, iVar3 <= iVar1)) {
    in_DI = in_SI;
  }
  return in_DI;
}

Assistant:

static inline uint16_t paeth_predictor_single(uint16_t left, uint16_t top,
                                              uint16_t top_left) {
  const int base = top + left - top_left;
  const int p_left = abs_diff(base, left);
  const int p_top = abs_diff(base, top);
  const int p_top_left = abs_diff(base, top_left);

  // Return nearest to base of left, top and top_left.
  return (p_left <= p_top && p_left <= p_top_left) ? left
         : (p_top <= p_top_left)                   ? top
                                                   : top_left;
}